

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.c
# Opt level: O3

void dump_args(mmt_memory_dump *args,int argc,uint64_t except_ptr)

{
  mmt_buf *pmVar1;
  uint uVar2;
  ulong uVar3;
  byte *pbVar4;
  uint uVar5;
  ulong uVar6;
  
  if (0 < argc) {
    uVar3 = 0;
    do {
      if (args[uVar3].addr != except_ptr) {
        pmVar1 = args[uVar3].data;
        if (indent_logs == 0) {
          fprintf(_stdout,"LOG:         addr: 0x%016llx, size: %d, data:",args[uVar3].addr,
                  (ulong)pmVar1->len);
        }
        else {
          fprintf(_stdout,"%64s        addr: 0x%016llx, size: %d, data:"," ");
        }
        uVar2 = pmVar1->len;
        if (3 < uVar2) {
          uVar6 = 0;
          do {
            fprintf(_stdout," 0x%08x",(ulong)pmVar1[uVar6 + 1].len);
            uVar6 = uVar6 + 1;
            uVar2 = pmVar1->len;
          } while (uVar6 < uVar2 >> 2);
        }
        uVar5 = uVar2 & 0xfffffffc;
        if (uVar5 != uVar2) {
          pbVar4 = (byte *)((long)&pmVar1[1].len + (long)(int)uVar5);
          do {
            fprintf(_stdout," 0x%02x",(ulong)*pbVar4);
            pbVar4 = pbVar4 + 1;
            uVar5 = uVar5 + 1;
          } while (uVar5 < pmVar1->len);
        }
        fputc(10,_stdout);
        if (mmt_sync_fd != -1) {
          fflush(_stdout);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)argc);
  }
  return;
}

Assistant:

void dump_args(struct mmt_memory_dump *args, int argc, uint64_t except_ptr)
{
	int i, j;

	for (i = 0; i < argc; ++i)
	{
		struct mmt_memory_dump *arg = &args[i];
		struct mmt_buf *data = arg->data;
		if (arg->addr == except_ptr)
			continue;
		mmt_log("        addr: 0x%016llx, size: %d, data:",
				(unsigned long long)arg->addr, data->len);
		for (j = 0; j < data->len / 4; ++j)
			mmt_log_cont(" 0x%08x", ((uint32_t *)data->data)[j]);
		for (j = data->len / 4 * 4; j < data->len; ++j)
			mmt_log_cont(" 0x%02x", data->data[j]);
		mmt_log_cont_nl();
	}
}